

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

block_id_t __thiscall duckdb::SingleFileBlockManager::PeekFreeBlockId(SingleFileBlockManager *this)

{
  block_id_t bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->block_lock);
  if (iVar2 == 0) {
    p_Var3 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1;
    if ((this->free_list)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      p_Var3 = (_Base_ptr)&this->max_block;
    }
    bVar1 = *(block_id_t *)p_Var3;
    pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
    return bVar1;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

block_id_t SingleFileBlockManager::PeekFreeBlockId() {
	lock_guard<mutex> lock(block_lock);
	if (!free_list.empty()) {
		return *free_list.begin();
	} else {
		return max_block;
	}
}